

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

LatencyItem * __thiscall LatencyCollector::getAggrItem(LatencyCollector *this,string *lat_name)

{
  bool bVar1;
  ulong uVar2;
  LatencyItem *in_RSI;
  LatencyItem *in_RDI;
  string actual_name;
  LatencyItem *item;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
  *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  *__range1;
  MapWrapper *cur_map;
  MapWrapperSP cur_map_p;
  LatencyItem *ret;
  LatencyItem *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  byte in_stack_ffffffffffffff17;
  string local_d0 [32];
  string local_b0 [32];
  LatencyItem *local_90;
  reference local_88;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_true>
  local_80;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_true>
  local_78;
  MapWrapper *local_70;
  MapWrapper *local_68;
  undefined4 local_20;
  byte local_19;
  
  local_19 = 0;
  LatencyItem::LatencyItem(in_RDI);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ashared_ptr<MapWrapper>::ashared_ptr
              ((ashared_ptr<MapWrapper> *)
               CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               (ashared_ptr<MapWrapper> *)in_stack_ffffffffffffff08);
    local_70 = ashared_ptr<MapWrapper>::get((ashared_ptr<MapWrapper> *)0x106706);
    local_68 = local_70;
    local_78._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                  *)in_stack_ffffffffffffff08);
    local_80._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
                *)in_stack_ffffffffffffff08);
    while (bVar1 = std::__detail::operator!=(&local_78,&local_80), bVar1) {
      local_88 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
                 ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
                              *)0x10676d);
      local_90 = local_88->second;
      LatencyItem::getActualFunction_abi_cxx11_(in_RSI);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                              &in_stack_ffffffffffffff08->statName);
      if (bVar1) {
        local_20 = 3;
      }
      else {
        LatencyItem::getName_abi_cxx11_(in_stack_ffffffffffffff08);
        in_stack_ffffffffffffff17 = std::__cxx11::string::empty();
        std::__cxx11::string::~string(local_d0);
        if ((in_stack_ffffffffffffff17 & 1) == 0) {
          LatencyItem::operator+=
                    ((LatencyItem *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08);
        }
        else {
          LatencyItem::operator=
                    ((LatencyItem *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff08);
        }
        local_20 = 0;
      }
      std::__cxx11::string::~string(local_b0);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
                    *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
    }
    local_19 = 1;
    local_20 = 1;
    ashared_ptr<MapWrapper>::~ashared_ptr((ashared_ptr<MapWrapper> *)0x1068bc);
  }
  else {
    local_19 = 1;
    local_20 = 1;
  }
  if ((local_19 & 1) == 0) {
    LatencyItem::~LatencyItem
              ((LatencyItem *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10));
  }
  return in_RDI;
}

Assistant:

LatencyItem getAggrItem(const std::string& lat_name) {
        LatencyItem ret;
        if (lat_name.empty()) return ret;

        MapWrapperSP cur_map_p = latestMap;
        MapWrapper* cur_map = cur_map_p.get();

        for (auto& entry: cur_map->map) {
            LatencyItem *item = entry.second;
            std::string actual_name = item->getActualFunction();

            if (actual_name != lat_name) continue;

            if (ret.getName().empty()) {
                // Initialize.
                ret = *item;
            } else {
                // Already exists.
                ret += *item;
            }
        }

        return ret;
    }